

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puppet.hpp
# Opt level: O1

void henson::Puppet::exec(void *self_)

{
  undefined4 uVar1;
  Puppet *self;
  timespec ts;
  timespec local_30;
  
  do {
    *(undefined1 *)((long)self_ + 0x20) = 1;
    clock_gettime(0,&local_30);
    *(__time_t *)((long)self_ + 0x30) = local_30.tv_sec * 1000000000 + local_30.tv_nsec;
    uVar1 = (**(code **)((long)self_ + 0xb0))
                      (*(undefined4 *)((long)self_ + 0x90),*(undefined8 *)((long)self_ + 0x98));
    *(undefined4 *)((long)self_ + 0x28) = uVar1;
    *(undefined1 *)((long)self_ + 0x20) = 0;
    coro_transfer((long)self_ + 0x58,(long)self_ + 0x50);
  } while( true );
}

Assistant:

static void         exec(void* self_)
    {
        Puppet* self = (Puppet*) self_;

        while(true)
        {
            self->running_ = true;
            self->start_time_ = get_time();
            self->result_ = self->main_(self->argc_,&self->argv_[0]);
            self->running_ = false;
            self->yield();      // the time for the final portion will get recorded thanks to this call
        }
    }